

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofClear
          (MessageGenerator *this,Printer *p)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  ushort *puVar3;
  Printer *pPVar4;
  bool bVar5;
  value_type pOVar6;
  FieldDescriptor *field;
  FieldGenerator *this_01;
  cpp *this_02;
  undefined1 cap_next_letter;
  undefined8 uVar7;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  string_view input;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  int i;
  Formatter format;
  Iterator __begin4;
  Iterator __end4;
  Iterator __begin3;
  string result;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Iterator __end3;
  int local_1ac;
  Printer *local_1a8;
  value_type local_1a0;
  Formatter local_198;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  MessageGenerator *local_160;
  ctrl_t *local_158;
  Iterator local_150;
  string local_140;
  Iterator local_120;
  Sub local_110;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_58;
  Iterator local_40;
  
  local_1ac = 0;
  local_120.descriptor = this->descriptor_;
  local_120.idx = 0;
  local_40.idx = (local_120.descriptor)->real_oneof_decl_count_;
  local_160 = this;
  local_40.descriptor = local_120.descriptor;
  bVar5 = cpp::operator==(&local_120,&local_40);
  if (!bVar5) {
    this_00 = &local_198.vars_;
    paVar1 = &local_110.key_.field_2;
    local_160 = (MessageGenerator *)&local_160->field_generators_;
    local_158 = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
    local_1a8 = p;
    do {
      pPVar4 = local_1a8;
      pOVar6 = OneOfRangeImpl::Iterator::operator*(&local_120);
      local_198.vars_.
      super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = 0;
      local_198.vars_.
      super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
           0;
      local_198.vars_.
      super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      heap_or_soo_.heap.control = local_158;
      local_198.printer_ = pPVar4;
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"oneofname","");
      puVar3 = (ushort *)(pOVar6->all_names_).payload_;
      local_170._M_len = (size_t)*puVar3;
      local_170._M_str = (char *)((long)puVar3 + ~local_170._M_len);
      local_1a0 = pOVar6;
      io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
                (&local_110,&local_140,&local_170);
      vars.len_ = 1;
      vars.ptr_ = &local_110;
      io::Printer::WithDefs(&local_58,local_1a8,vars,false);
      if (local_110.annotation_.
          super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>.
          _M_payload.
          super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>
          .super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged
          == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   &local_110.annotation_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.value_.consume_after._M_dataplus._M_p !=
          &local_110.value_.consume_after.field_2) {
        operator_delete(local_110.value_.consume_after._M_dataplus._M_p,
                        local_110.value_.consume_after.field_2._M_allocated_capacity + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr
        [local_110.value_.value.
         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
         _M_index]._M_data)((anon_class_1_0_00000001 *)&local_150,&local_110.value_.value);
      local_110.value_.value.
      super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
      .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
      _M_index = 0xff;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.key_._M_dataplus._M_p != paVar1) {
        operator_delete(local_110.key_._M_dataplus._M_p,
                        CONCAT71(local_110.key_.field_2._M_allocated_capacity._1_7_,
                                 local_110.key_.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      format_00._M_str =
           "void $classname$::clear_$oneofname$() {\n// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n"
      ;
      format_00._M_len = 100;
      io::Printer::
      FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (local_198.printer_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),this_00,format_00);
      (local_198.printer_)->indent_ =
           (local_198.printer_)->indent_ + ((local_198.printer_)->options_).spaces_per_indent;
      format_01._M_str = "$pbi$::TSanWrite(&_impl_);\n";
      format_01._M_len = 0x1b;
      io::Printer::
      FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (local_198.printer_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),this_00,format_01);
      format_02._M_str = "switch ($oneofname$_case()) {\n";
      format_02._M_len = 0x1e;
      uVar7 = 0x1e;
      io::Printer::
      FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (local_198.printer_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),this_00,format_02);
      pPVar4 = local_1a8;
      (local_198.printer_)->indent_ =
           (local_198.printer_)->indent_ + ((local_198.printer_)->options_).spaces_per_indent;
      local_170._M_len = local_170._M_len & 0xffffffff00000000;
      local_170._M_str = (char *)local_1a0;
      local_150.idx = local_1a0->field_count_;
      local_150.descriptor = local_1a0;
      while( true ) {
        cap_next_letter = (undefined1)uVar7;
        bVar5 = protobuf::internal::operator==((Iterator *)&local_170,&local_150);
        if (bVar5) break;
        field = protobuf::internal::FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::
                operator*((Iterator *)&local_170);
        puVar3 = (ushort *)(field->all_names_).payload_;
        this_02 = (cpp *)(ulong)*puVar3;
        input._M_len = (long)puVar3 + ~(ulong)this_02;
        input._M_str = (char *)0x1;
        UnderscoresToCamelCase_abi_cxx11_(&local_110.key_,this_02,input,(bool)cap_next_letter);
        Formatter::operator()(&local_198,"case k$1$: {\n",&local_110.key_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.key_._M_dataplus._M_p != paVar1) {
          operator_delete(local_110.key_._M_dataplus._M_p,
                          CONCAT71(local_110.key_.field_2._M_allocated_capacity._1_7_,
                                   local_110.key_.field_2._M_local_buf[0]) + 1);
        }
        (local_198.printer_)->indent_ =
             (local_198.printer_)->indent_ + ((local_198.printer_)->options_).spaces_per_indent;
        bVar5 = IsStringOrMessage(field);
        if (bVar5) {
          this_01 = FieldGeneratorTable::get((FieldGeneratorTable *)local_160,field);
          FieldGenerator::GenerateClearingCode(this_01,pPVar4);
        }
        else {
          format_03._M_str = "// No need to clear\n";
          format_03._M_len = 0x14;
          io::Printer::
          FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                    (local_198.printer_,
                     (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )ZEXT816(0),this_00,format_03);
        }
        format_04._M_str = "break;\n";
        format_04._M_len = 7;
        io::Printer::
        FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (local_198.printer_,
                   (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )ZEXT816(0),this_00,format_04);
        io::Printer::Outdent(local_198.printer_);
        format_05._M_str = "}\n";
        format_05._M_len = 2;
        uVar7 = 2;
        io::Printer::
        FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (local_198.printer_,
                   (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )ZEXT816(0),this_00,format_05);
        local_170._M_len = CONCAT44(local_170._M_len._4_4_,(int)local_170._M_len + 1);
      }
      puVar3 = (ushort *)(local_1a0->all_names_).payload_;
      uVar2 = *puVar3;
      local_110.key_._M_string_length = 0;
      local_110.key_.field_2._M_local_buf[0] = '\0';
      local_110.key_._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::resize((ulong)&local_110,(char)uVar2);
      absl::lts_20250127::ascii_internal::AsciiStrToUpper
                (local_110.key_._M_dataplus._M_p,
                 (Nullable<const_char_*>)((long)puVar3 + ~(ulong)uVar2),(ulong)uVar2);
      Formatter::operator()(&local_198,"case $1$_NOT_SET: {\n  break;\n}\n",&local_110.key_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.key_._M_dataplus._M_p != paVar1) {
        operator_delete(local_110.key_._M_dataplus._M_p,
                        CONCAT71(local_110.key_.field_2._M_allocated_capacity._1_7_,
                                 local_110.key_.field_2._M_local_buf[0]) + 1);
      }
      io::Printer::Outdent(local_198.printer_);
      puVar3 = (ushort *)(local_1a0->all_names_).payload_;
      uVar2 = *puVar3;
      local_110.key_._M_string_length = 0;
      local_110.key_.field_2._M_local_buf[0] = '\0';
      local_110.key_._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::resize((ulong)&local_110,(char)uVar2);
      absl::lts_20250127::ascii_internal::AsciiStrToUpper
                (local_110.key_._M_dataplus._M_p,
                 (Nullable<const_char_*>)((long)puVar3 + ~(ulong)uVar2),(ulong)uVar2);
      Formatter::operator()
                (&local_198,"}\n$oneof_case$[$1$] = $2$_NOT_SET;\n",&local_1ac,&local_110.key_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.key_._M_dataplus._M_p != paVar1) {
        operator_delete(local_110.key_._M_dataplus._M_p,
                        CONCAT71(local_110.key_.field_2._M_allocated_capacity._1_7_,
                                 local_110.key_.field_2._M_local_buf[0]) + 1);
      }
      io::Printer::Outdent(local_198.printer_);
      format_06._M_str = "}\n\n";
      format_06._M_len = 3;
      io::Printer::
      FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (local_198.printer_,
                 (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )ZEXT816(0),this_00,format_06);
      local_1ac = local_1ac + 1;
      absl::lts_20250127::
      Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
      ::~Cleanup(&local_58);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)this_00);
      local_120.idx = local_120.idx + 1;
      bVar5 = cpp::operator==(&local_120,&local_40);
    } while (!bVar5);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateOneofClear(io::Printer* p) {
  // Generated function clears the active field and union case (e.g. foo_case_).
  int i = 0;
  for (auto oneof : OneOfRange(descriptor_)) {
    Formatter format(p);
    auto v = p->WithVars({{"oneofname", oneof->name()}});

    format(
        "void $classname$::clear_$oneofname$() {\n"
        "// @@protoc_insertion_point(one_of_clear_start:$full_name$)\n");
    format.Indent();
    format("$pbi$::TSanWrite(&_impl_);\n");
    format("switch ($oneofname$_case()) {\n");
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      // We clear only allocated objects in oneofs
      if (!IsStringOrMessage(field)) {
        format("// No need to clear\n");
      } else {
        field_generators_.get(field).GenerateClearingCode(p);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        absl::AsciiStrToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "$oneof_case$[$1$] = $2$_NOT_SET;\n",
        i, absl::AsciiStrToUpper(oneof->name()));
    format.Outdent();
    format(
        "}\n"
        "\n");
    ++i;
  }
}